

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O3

void fsg_search_word_trans(fsg_search_t *fsgs)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int32 iVar6;
  fsg_hist_entry_t *pfVar7;
  int32 *piVar8;
  glist_t pgVar9;
  int score;
  int id;
  fsg_pnode_t *ptr;
  
  iVar6 = fsg_history_n_entries(fsgs->history);
  id = fsgs->bpidx_start;
  if (id < iVar6) {
    iVar2 = fsgs->beam;
    iVar3 = fsgs->frame;
    iVar4 = fsgs->bestscore;
    do {
      pfVar7 = fsg_history_entry_get(fsgs->history,id);
      if (pfVar7 == (fsg_hist_entry_t *)0x0) {
        __assert_fail("hist_entry",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                      ,0x279,"void fsg_search_word_trans(fsg_search_t *)");
      }
      if (fsgs->frame != pfVar7->frame) {
        __assert_fail("fsgs->frame == fsg_hist_entry_frame(hist_entry)",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                      ,0x27b,"void fsg_search_word_trans(fsg_search_t *)");
      }
      if (pfVar7->fsglink == (fsg_link_t *)0x0) {
        piVar8 = &fsgs->fsg->start_state;
      }
      else {
        piVar8 = &pfVar7->fsglink->to_state;
      }
      ptr = fsgs->lextree->root[*piVar8];
      if (ptr != (fsg_pnode_t *)0x0) {
        iVar5 = pfVar7->score;
        sVar1 = pfVar7->lc;
        do {
          if ((((((ptr->ctxt).bv[(int)sVar1 >> 5] & 1 << ((byte)sVar1 & 0x1f)) != 0) &&
               (((pfVar7->rc).bv[ptr->ci_ext >> 5] >> (ptr->ci_ext & 0x1f) & 1) != 0)) &&
              (score = ptr->logs2prob + iVar5, iVar2 + iVar4 < score)) &&
             ((ptr->hmm).score[0] < score)) {
            if ((ptr->hmm).frame <= iVar3) {
              pgVar9 = glist_add_ptr(fsgs->pnode_active_next,ptr);
              fsgs->pnode_active_next = pgVar9;
            }
            hmm_enter(&ptr->hmm,score,id,iVar3 + 1);
          }
          ptr = ptr->sibling;
        } while (ptr != (fsg_pnode_s *)0x0);
      }
      id = id + 1;
    } while (id != iVar6);
  }
  return;
}

Assistant:

static void
fsg_search_word_trans(fsg_search_t *fsgs)
{
    int32 bpidx, n_entries;
    fsg_hist_entry_t *hist_entry;
    fsg_link_t *l;
    int32 score, newscore, thresh, nf, d;
    fsg_pnode_t *root;
    int32 lc, rc;

    n_entries = fsg_history_n_entries(fsgs->history);

    thresh = fsgs->bestscore + fsgs->beam;
    nf = fsgs->frame + 1;

    for (bpidx = fsgs->bpidx_start; bpidx < n_entries; bpidx++) {
        hist_entry = fsg_history_entry_get(fsgs->history, bpidx);
        assert(hist_entry);
        score = fsg_hist_entry_score(hist_entry);
        assert(fsgs->frame == fsg_hist_entry_frame(hist_entry));

        l = fsg_hist_entry_fsglink(hist_entry);

        /* Destination state for hist_entry */
        d = l ? fsg_link_to_state(l) : fsg_model_start_state(fsgs->
                                                                fsg);

        lc = fsg_hist_entry_lc(hist_entry);

        /* Transition to all root nodes attached to state d */
        for (root = fsg_lextree_root(fsgs->lextree, d);
             root; root = root->sibling) {
            rc = root->ci_ext;

            if ((root->ctxt.bv[lc >> 5] & (1 << (lc & 0x001f))) &&
                (hist_entry->rc.bv[rc >> 5] & (1 << (rc & 0x001f)))) {
                /*
                 * Last CIphone of history entry is in left-context list supported by
                 * target root node, and
                 * first CIphone of target root node is in right context list supported
                 * by history entry;
                 * So the transition can go ahead (if new score is good enough).
                 */
                newscore = score + root->logs2prob;

                if ((newscore BETTER_THAN thresh)
                    && (newscore BETTER_THAN hmm_in_score(&root->hmm))) {
                    if (hmm_frame(&root->hmm) < nf) {
                        /* Newly activated node; add to active list */
                        fsgs->pnode_active_next =
                            glist_add_ptr(fsgs->pnode_active_next,
                                          (void *) root);
#if __FSG_DBG__
                        E_INFO
                            ("[%5d] WordTrans bpidx[%d] -> pnode[%08x] (activated)\n",
                             fsgs->frame, bpidx, (int32) root);
#endif
                    }
                    else {
#if __FSG_DBG__
                        E_INFO
                            ("[%5d] WordTrans bpidx[%d] -> pnode[%08x]\n",
                             fsgs->frame, bpidx, (int32) root);
#endif
                    }

                    hmm_enter(&root->hmm, newscore, bpidx, nf);
                }
            }
        }
    }
}